

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::LoadFonts(CTextRender *this,IStorage *pStorage,IConsole *pConsole)

{
  int iVar1;
  char *pcVar2;
  json_value *pjVar3;
  _json_value *p_Var4;
  long lVar5;
  void *pvVar6;
  _json_value *p_Var7;
  CFontLanguageVariant *pCVar8;
  long *in_RDX;
  json_settings *in_RSI;
  CTextRender *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  json_value *pFamilyName;
  int i_2;
  json_object_entry *Entries;
  json_value *rVariant;
  uint i_1;
  json_value *rFallbackFaces;
  json_value *rDefaultFace;
  long FileSize_1;
  IOHANDLE File_1;
  uint i;
  json_value *rFiles;
  json_value *pJsonData;
  char *pFileData;
  int FileSize;
  IOHANDLE File;
  char *pFilename;
  json_settings JsonSettings;
  char aFileName [128];
  char aBuf [256];
  char aFilename [512];
  char aFontName [512];
  char aError [256];
  json_value *value;
  CGlyphMap *this_00;
  CGlyphMap *in_stack_fffffffffffff888;
  long in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 uVar10;
  int local_744;
  uint local_72c;
  uint local_704;
  char *pcVar11;
  char local_688 [128];
  char local_608 [256];
  undefined1 local_508 [512];
  char local_308 [512];
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar11 = "fonts/index.json";
  value = (json_value *)0x0;
  this_00 = (CGlyphMap *)0x0;
  pcVar2 = (char *)(**(code **)(in_RSI->max_memory + 0x20))
                             (in_RSI,"fonts/index.json",1,0xffffffff,0,0);
  if (pcVar2 == (char *)0x0) {
    (**(code **)(*in_RDX + 200))(in_RDX,1,"textrender","couldn\'t open fonts index file",0);
  }
  else {
    io_length((IOHANDLE)this_00);
    mem_alloc(0);
    io_read((IOHANDLE)this_00,value,0);
    io_close((IOHANDLE)0x1421d7);
    mem_zero(this_00,(uint)((ulong)value >> 0x20));
    pjVar3 = json_parse_ex(in_RSI,(char *)in_RDX,(size_t)pcVar11,pcVar2);
    mem_free((void *)0x142223);
    if (pjVar3 == (json_value *)0x0) {
      (**(code **)(*in_RDX + 200))(in_RDX,1,pcVar11,local_108,0);
    }
    else {
      p_Var4 = _json_value::operator[]((_json_value *)in_stack_fffffffffffff888,(char *)this_00);
      if (p_Var4->type == json_array) {
        for (local_704 = 0; bVar9 = local_704 < (p_Var4->u).string.length,
            uVar10 = bVar9 && local_704 < 0x10, bVar9 && local_704 < 0x10; local_704 = local_704 + 1
            ) {
          pcVar2 = local_308;
          p_Var7 = _json_value::operator[](p_Var4,local_704);
          pcVar11 = _json_value::operator_cast_to_char_(p_Var7);
          str_format(pcVar2,0x200,"fonts/%s",pcVar11);
          value = (json_value *)0x0;
          this_00 = (CGlyphMap *)0x0;
          lVar5 = (**(code **)(in_RSI->max_memory + 0x20))
                            (in_RSI,local_308,1,0xffffffff,local_508,0x200);
          if (lVar5 != 0) {
            io_length((IOHANDLE)this_00);
            pvVar6 = mem_alloc(0);
            in_RDI->m_apFontData[local_704] = pvVar6;
            io_read((IOHANDLE)this_00,value,0);
            io_close((IOHANDLE)0x1423b8);
            iVar1 = LoadFontCollection(in_RDI,(void *)CONCAT17(uVar10,in_stack_fffffffffffff8a0),
                                       pcVar2,in_stack_fffffffffffff890);
            if (iVar1 != 0) {
              str_format(local_608,0x100,"failed to load font. filename=\'%s\'",local_308);
              (**(code **)(*in_RDX + 200))(in_RDX,0,"textrender",local_608);
            }
          }
        }
      }
      p_Var4 = _json_value::operator[]((_json_value *)in_stack_fffffffffffff888,(char *)this_00);
      if (p_Var4->type == json_string) {
        _json_value::operator_cast_to_char_(p_Var4);
        CGlyphMap::SetDefaultFaceByName(this_00,(char *)value);
      }
      p_Var4 = _json_value::operator[]((_json_value *)in_stack_fffffffffffff888,(char *)this_00);
      if (p_Var4->type == json_array) {
        for (local_72c = 0; local_72c < (p_Var4->u).string.length; local_72c = local_72c + 1) {
          in_stack_fffffffffffff888 = in_RDI->m_pGlyphMap;
          p_Var7 = _json_value::operator[](p_Var4,local_72c);
          _json_value::operator_cast_to_char_(p_Var7);
          CGlyphMap::AddFallbackFaceByName(this_00,(char *)value);
        }
      }
      p_Var4 = _json_value::operator[]((_json_value *)in_stack_fffffffffffff888,(char *)this_00);
      if (p_Var4->type == json_object) {
        in_RDI->m_NumVariants = (p_Var4->u).boolean;
        pcVar2 = (p_Var4->u).string.ptr;
        pCVar8 = (CFontLanguageVariant *)mem_alloc(0);
        in_RDI->m_paVariants = pCVar8;
        for (local_744 = 0; local_744 < in_RDI->m_NumVariants; local_744 = local_744 + 1) {
          str_format(local_688,0x80,"languages/%s.json",
                     *(undefined8 *)(pcVar2 + (long)local_744 * 0x18));
          str_copy((char *)this_00,(char *)value,0);
          if (*(int *)(*(long *)((p_Var4->u).string.ptr + (long)local_744 * 0x18 + 0x10) + 8) == 5)
          {
            str_copy((char *)this_00,(char *)value,0);
          }
          else {
            in_RDI->m_paVariants[local_744].m_aFamilyName[0] = '\0';
          }
        }
      }
      json_value_free(value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::LoadFonts(IStorage *pStorage, IConsole *pConsole)
{
	// read file data into buffer
	const char *pFilename = "fonts/index.json";

	IOHANDLE File = pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "textrender", "couldn't open fonts index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract font file definitions
	const json_value &rFiles = (*pJsonData)["font files"];
	if(rFiles.type == json_array)
	{
		for(unsigned i = 0; i < rFiles.u.array.length && i < MAX_FACES; ++i)
		{
			char aFontName[IO_MAX_PATH_LENGTH];
			str_format(aFontName, sizeof(aFontName), "fonts/%s", (const char *)rFiles[i]);
			char aFilename[IO_MAX_PATH_LENGTH];
			IOHANDLE File = pStorage->OpenFile(aFontName, IOFLAG_READ, IStorage::TYPE_ALL, aFilename, sizeof(aFilename));
			if(File)
			{
				long FileSize = io_length(File);
				m_apFontData[i] = mem_alloc(FileSize);
				io_read(File, m_apFontData[i], FileSize);
				io_close(File);
				if(LoadFontCollection(aFilename, m_apFontData[i], FileSize))
				{
					char aBuf[256];	
					str_format(aBuf, sizeof(aBuf), "failed to load font. filename='%s'", aFontName);	
					pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "textrender", aBuf);
				}
			}
		}
	}

	// extract default family name
	const json_value &rDefaultFace = (*pJsonData)["default"];
	if(rDefaultFace.type == json_string)
	{
		m_pGlyphMap->SetDefaultFaceByName((const char *)rDefaultFace);
	}

	// extract fallback family names
	const json_value &rFallbackFaces = (*pJsonData)["fallbacks"];
	if(rFallbackFaces.type == json_array)
	{
		for(unsigned i = 0; i < rFallbackFaces.u.array.length; ++i)
		{
			m_pGlyphMap->AddFallbackFaceByName((const char *)rFallbackFaces[i]);
		}
	}

	// extract language variant family names
	const json_value &rVariant = (*pJsonData)["language variants"];
	if(rVariant.type == json_object)
	{
		m_NumVariants = rVariant.u.object.length;
		json_object_entry *Entries = rVariant.u.object.values;
		m_paVariants = (CFontLanguageVariant *)mem_alloc(sizeof(CFontLanguageVariant)*m_NumVariants);
		for(int i = 0; i < m_NumVariants; ++i)
		{
			char aFileName[128];
			str_format(aFileName, sizeof(aFileName), "languages/%s.json", (const char *)Entries[i].name);
			str_copy(m_paVariants[i].m_aLanguageFile, aFileName, sizeof(m_paVariants[i].m_aLanguageFile));

			json_value *pFamilyName = rVariant.u.object.values[i].value;
			if(pFamilyName->type == json_string)
				str_copy(m_paVariants[i].m_aFamilyName, pFamilyName->u.string.ptr, sizeof(m_paVariants[i].m_aFamilyName));
			else
				m_paVariants[i].m_aFamilyName[0] = 0;
		}
	}

	json_value_free(pJsonData);
}